

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::SourceCodeInfo::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  SourceCodeInfo **v1;
  SourceCodeInfo **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *this;
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *other;
  anon_union_56_1_493b367e_for_SourceCodeInfo_3 *this_00;
  SourceCodeInfo *extendee;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  SourceCodeInfo *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  SourceCodeInfo *from;
  SourceCodeInfo *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (SourceCodeInfo *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (SourceCodeInfo *)to_msg;
  _this = (SourceCodeInfo *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::SourceCodeInfo_const*>(&local_38);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::SourceCodeInfo*>
                 (&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::SourceCodeInfo_const*,google::protobuf::SourceCodeInfo*>
                       (v1,v2,"&from != _this");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x3acf,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  this = _internal_mutable_location(from);
  other = _internal_location((SourceCodeInfo *)absl_log_internal_check_op_result);
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::MergeFrom(this,other);
  this_00 = &from->field_0;
  extendee = default_instance();
  internal::ExtensionSet::MergeFrom
            (&(this_00->_impl_)._extensions_,(MessageLite *)extendee,
             (ExtensionSet *)(absl_log_internal_check_op_result + 0x10));
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)(absl_log_internal_check_op_result + 8));
  return;
}

Assistant:

void SourceCodeInfo::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<SourceCodeInfo*>(&to_msg);
  auto& from = static_cast<const SourceCodeInfo&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.SourceCodeInfo)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_location()->MergeFrom(
      from._internal_location());
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}